

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_edge_iterator.cc
# Opt level: O3

Edge * __thiscall s2shapeutil::EdgeIterator::edge(Edge *__return_storage_ptr__,EdgeIterator *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  S2LogMessage SStack_28;
  
  iVar2 = this->shape_id_;
  iVar1 = (*this->index_->_vptr_S2ShapeIndex[2])();
  if (iVar2 < iVar1) {
    iVar2 = (*this->index_->_vptr_S2ShapeIndex[3])(this->index_,(ulong)(uint)this->shape_id_);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
              (__return_storage_ptr__,(long *)CONCAT44(extraout_var,iVar2),this->edge_id_);
    return __return_storage_ptr__;
  }
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_edge_iterator.cc"
             ,0x1c,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: !Done() ",0x16);
  abort();
}

Assistant:

S2Shape::Edge EdgeIterator::edge() const {
  S2_DCHECK(!Done());
  return index_->shape(shape_id_)->edge(edge_id_);
}